

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> * __thiscall
NavierStokesBase::fetchBCArray
          (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *__return_storage_ptr__,
          NavierStokesBase *this,int State_Type,int scomp,int ncomp)

{
  pointer pBVar1;
  BCRec *pBVar2;
  undefined4 in_register_0000000c;
  long lVar3;
  ulong uVar4;
  long lVar5;
  allocator_type local_39;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000000c,scomp);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            (&__return_storage_ptr__->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
             (long)ncomp,&local_39);
  if (0 < ncomp) {
    lVar5 = 0xc;
    uVar4 = 0;
    do {
      pBVar2 = amrex::StateDescriptor::getBC
                         ((this->super_AmrLevel).state.
                          super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                          super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                          _M_impl.super__Vector_impl_data._M_start[State_Type].desc,
                          (int)local_38 + (int)uVar4);
      pBVar1 = (__return_storage_ptr__->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
               super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = -3;
      do {
        *(int *)((long)pBVar1->bc + lVar3 * 4 + lVar5) = pBVar2->bc[lVar3 + 3];
        *(int *)((long)pBVar1->bc + lVar3 * 4 + lVar5 + 0xc) = pBVar2[1].bc[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar4 != (uint)ncomp);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<BCRec>
NavierStokesBase::fetchBCArray (int State_Type, int scomp, int ncomp)
{
    Vector<BCRec> bc(ncomp);
    const StateDescriptor* stDesc;
    const Box& domain = geom.Domain();

    for (int n(0); n < ncomp; ++n)
    {
      stDesc=state[State_Type].descriptor();
      setBC(domain,domain,stDesc->getBC(scomp+n), bc[n] );
    }

    return bc;
}